

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate.c
# Opt level: O0

int deflateInit2_(z_streamp strm,int level,int method,int windowBits,int memLevel,int strategy,
                 char *version,int stream_size)

{
  internal_state_conflict *piVar1;
  Bytef *pBVar2;
  Posf *pPVar3;
  ushf *overlay;
  int wrap;
  deflate_state *s;
  int strategy_local;
  int memLevel_local;
  int windowBits_local;
  int method_local;
  int level_local;
  z_streamp strm_local;
  
  overlay._4_4_ = 1;
  if (((version == (char *)0x0) || (*version != '1')) || (stream_size != 0x70)) {
    strm_local._4_4_ = -6;
  }
  else if (strm == (z_streamp)0x0) {
    strm_local._4_4_ = -2;
  }
  else {
    strm->msg = (char *)0x0;
    if (strm->zalloc == (alloc_func)0x0) {
      strm->zalloc = zcalloc;
      strm->opaque = (voidpf)0x0;
    }
    if (strm->zfree == (free_func)0x0) {
      strm->zfree = zcfree;
    }
    windowBits_local = level;
    if (level == -1) {
      windowBits_local = 6;
    }
    if (windowBits < 0) {
      overlay._4_4_ = 0;
      strategy_local = -windowBits;
    }
    else {
      strategy_local = windowBits;
      if (0xf < windowBits) {
        overlay._4_4_ = 2;
        strategy_local = windowBits + -0x10;
      }
    }
    if (((((memLevel < 1) || (9 < memLevel)) ||
         ((method != 8 || ((strategy_local < 8 || (0xf < strategy_local)))))) ||
        (windowBits_local < 0)) || (((9 < windowBits_local || (strategy < 0)) || (4 < strategy)))) {
      strm_local._4_4_ = -2;
    }
    else {
      if (strategy_local == 8) {
        strategy_local = 9;
      }
      piVar1 = (internal_state_conflict *)(*strm->zalloc)(strm->opaque,1,0x1730);
      if (piVar1 == (internal_state_conflict *)0x0) {
        strm_local._4_4_ = -4;
      }
      else {
        strm->state = piVar1;
        piVar1->strm = strm;
        piVar1->wrap = overlay._4_4_;
        piVar1->gzhead = (gz_headerp)0x0;
        piVar1->w_bits = strategy_local;
        piVar1->w_size = 1 << ((byte)piVar1->w_bits & 0x1f);
        piVar1->w_mask = piVar1->w_size - 1;
        piVar1->hash_bits = memLevel + 7;
        piVar1->hash_size = 1 << ((byte)piVar1->hash_bits & 0x1f);
        piVar1->hash_mask = piVar1->hash_size - 1;
        piVar1->hash_shift = (piVar1->hash_bits + 2) / 3;
        pBVar2 = (Bytef *)(*strm->zalloc)(strm->opaque,piVar1->w_size,2);
        piVar1->window = pBVar2;
        pPVar3 = (Posf *)(*strm->zalloc)(strm->opaque,piVar1->w_size,2);
        piVar1->prev = pPVar3;
        pPVar3 = (Posf *)(*strm->zalloc)(strm->opaque,piVar1->hash_size,2);
        piVar1->head = pPVar3;
        piVar1->high_water = 0;
        piVar1->lit_bufsize = 1 << ((char)memLevel + 6U & 0x1f);
        pBVar2 = (Bytef *)(*strm->zalloc)(strm->opaque,piVar1->lit_bufsize,4);
        piVar1->pending_buf = pBVar2;
        piVar1->pending_buf_size = (ulong)piVar1->lit_bufsize << 2;
        if (((piVar1->window == (Bytef *)0x0) || (piVar1->prev == (Posf *)0x0)) ||
           ((piVar1->head == (Posf *)0x0 || (piVar1->pending_buf == (Bytef *)0x0)))) {
          piVar1->status = 0x29a;
          strm->msg = "insufficient memory";
          deflateEnd(strm);
          strm_local._4_4_ = -4;
        }
        else {
          piVar1->d_buf = (ushf *)(pBVar2 + (ulong)(piVar1->lit_bufsize >> 1) * 2);
          piVar1->l_buf = piVar1->pending_buf + (ulong)piVar1->lit_bufsize * 3;
          piVar1->level = windowBits_local;
          piVar1->strategy = strategy;
          piVar1->method = '\b';
          strm_local._4_4_ = deflateReset(strm);
        }
      }
    }
  }
  return strm_local._4_4_;
}

Assistant:

int ZEXPORT deflateInit2_(z_streamp strm, int  level, int  method, int  windowBits, int  memLevel, int  strategy,
                  const char *version, int stream_size)
{
    deflate_state *s;
    int wrap = 1;
    static const char my_version[] = ZLIB_VERSION;

    ushf *overlay;
    /* We overlay pending_buf and d_buf+l_buf. This works since the average
     * output size for (length,distance) codes is <= 24 bits.
     */

    if (version == Z_NULL || version[0] != my_version[0] ||
        stream_size != sizeof(z_stream)) {
        return Z_VERSION_ERROR;
    }
    if (strm == Z_NULL) return Z_STREAM_ERROR;

    strm->msg = Z_NULL;
    if (strm->zalloc == (alloc_func)0) {
        strm->zalloc = zcalloc;
        strm->opaque = (voidpf)0;
    }
    if (strm->zfree == (free_func)0) strm->zfree = zcfree;

#ifdef FASTEST
    if (level != 0) level = 1;
#else
    if (level == Z_DEFAULT_COMPRESSION) level = 6;
#endif

    if (windowBits < 0) { /* suppress zlib wrapper */
        wrap = 0;
        windowBits = -windowBits;
    }
#ifdef GZIP
    else if (windowBits > 15) {
        wrap = 2;       /* write gzip wrapper instead */
        windowBits -= 16;
    }
#endif
    if (memLevel < 1 || memLevel > MAX_MEM_LEVEL || method != Z_DEFLATED ||
        windowBits < 8 || windowBits > 15 || level < 0 || level > 9 ||
        strategy < 0 || strategy > Z_FIXED) {
        return Z_STREAM_ERROR;
    }
    if (windowBits == 8) windowBits = 9;  /* until 256-byte window bug fixed */
    s = (deflate_state *) ZALLOC(strm, 1, sizeof(deflate_state));
    if (s == Z_NULL) return Z_MEM_ERROR;
    strm->state = (struct internal_state FAR *)s;
    s->strm = strm;

    s->wrap = wrap;
    s->gzhead = Z_NULL;
    s->w_bits = windowBits;
    s->w_size = 1 << s->w_bits;
    s->w_mask = s->w_size - 1;

    s->hash_bits = memLevel + 7;
    s->hash_size = 1 << s->hash_bits;
    s->hash_mask = s->hash_size - 1;
    s->hash_shift =  ((s->hash_bits+MIN_MATCH-1)/MIN_MATCH);

    s->window = (Bytef *) ZALLOC(strm, s->w_size, 2*sizeof(Byte));
    s->prev   = (Posf *)  ZALLOC(strm, s->w_size, sizeof(Pos));
    s->head   = (Posf *)  ZALLOC(strm, s->hash_size, sizeof(Pos));

    s->high_water = 0;      /* nothing written to s->window yet */

    s->lit_bufsize = 1 << (memLevel + 6); /* 16K elements by default */

    overlay = (ushf *) ZALLOC(strm, s->lit_bufsize, sizeof(ush)+2);
    s->pending_buf = (uchf *) overlay;
    s->pending_buf_size = (ulg)s->lit_bufsize * (sizeof(ush)+2L);

    if (s->window == Z_NULL || s->prev == Z_NULL || s->head == Z_NULL ||
        s->pending_buf == Z_NULL) {
        s->status = FINISH_STATE;
        strm->msg = (char*)ERR_MSG(Z_MEM_ERROR);
        deflateEnd (strm);
        return Z_MEM_ERROR;
    }
    s->d_buf = overlay + s->lit_bufsize/sizeof(ush);
    s->l_buf = s->pending_buf + (1+sizeof(ush))*s->lit_bufsize;

    s->level = level;
    s->strategy = strategy;
    s->method = (Byte)method;

    return deflateReset(strm);
}